

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O3

void __thiscall tst_GenericModel::removeRow_data(tst_GenericModel *this)

{
  int iVar1;
  
  QTest::addColumnInternal(2,"insertCol");
  iVar1 = QTest::newRow("No Columns");
  QTestData::append(iVar1,(void *)0x2);
  iVar1 = QTest::newRow("One Column");
  QTestData::append(iVar1,(void *)0x2);
  iVar1 = QTest::newRow("Multiple Columns");
  QTestData::append(iVar1,(void *)0x2);
  return;
}

Assistant:

void tst_GenericModel::removeRow_data()
{
    QTest::addColumn<int>("insertCol");
#ifndef SKIP_QTBUG_92886
    QTest::newRow("No Columns") << 0;
#endif
    QTest::newRow("One Column") << 1;
    QTest::newRow("Multiple Columns") << 3;
}